

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

void test_mp_cond_swap(void)

{
  mp_int *x0;
  mp_int *x1;
  size_t sVar1;
  ulong uVar2;
  
  x0 = mp_random_bits_fn(0x200,random_read);
  x1 = mp_random_bits_fn(0x200,random_read);
  sVar1 = (*looplimit)(0x10);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      mp_cond_swap(x0,x1,(uint)uVar2 & 1);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      uVar2 = uVar2 + 1;
      sVar1 = (*looplimit)(0x10);
    } while (uVar2 < sVar1);
  }
  mp_free(x0);
  mp_free(x1);
  return;
}

Assistant:

static void test_mp_cond_swap(void)
{
    mp_int *a = mp_random_bits(512);
    mp_int *b = mp_random_bits(512);
    for (size_t i = 0; i < looplimit(16); i++) {
        log_start();
        mp_cond_swap(a, b, i & 1);
        log_end();
    }
    mp_free(a);
    mp_free(b);
}